

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask24_24(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 0x18 | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] >> 8;
  *puVar1 = in[2] << 0x10 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[2] >> 0x10;
  *puVar1 = in[3] << 8 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[4];
  *puVar1 = in[5] << 0x18 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[5] >> 8;
  *puVar1 = in[6] << 0x10 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[6] >> 0x10;
  *puVar1 = in[7] << 8 | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[8];
  *puVar1 = in[9] << 0x18 | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[9] >> 8;
  *puVar1 = in[10] << 0x10 | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[10] >> 0x10;
  *puVar1 = in[0xb] << 8 | *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[0xc];
  *puVar1 = in[0xd] << 0x18 | *puVar1;
  puVar1 = out + 10;
  *puVar1 = in[0xd] >> 8;
  *puVar1 = in[0xe] << 0x10 | *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = in[0xe] >> 0x10;
  *puVar1 = in[0xf] << 8 | *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = in[0x10];
  *puVar1 = in[0x11] << 0x18 | *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = in[0x11] >> 8;
  *puVar1 = in[0x12] << 0x10 | *puVar1;
  puVar1 = out + 0xe;
  *puVar1 = in[0x12] >> 0x10;
  *puVar1 = in[0x13] << 8 | *puVar1;
  puVar1 = out + 0xf;
  *puVar1 = in[0x14];
  *puVar1 = in[0x15] << 0x18 | *puVar1;
  puVar1 = out + 0x10;
  *puVar1 = in[0x15] >> 8;
  *puVar1 = in[0x16] << 0x10 | *puVar1;
  puVar1 = out + 0x11;
  *puVar1 = in[0x16] >> 0x10;
  *puVar1 = in[0x17] << 8 | *puVar1;
  return out + 0x12;
}

Assistant:

uint32_t *__fastpackwithoutmask24_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (24 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (24 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (24 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (24 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (24 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (24 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (24 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (24 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (24 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (24 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (24 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (24 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  ++in;

  return out;
}